

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UCharsTrieBuilder::countElementUnits
          (UCharsTrieBuilder *this,int32_t start,int32_t limit,int32_t unitIndex)

{
  short sVar1;
  int iVar2;
  char16_t cVar3;
  uint uVar4;
  int32_t i;
  uint uVar5;
  char16_t *pcVar6;
  long lVar7;
  char16_t cVar8;
  
  sVar1 = (this->strings).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar5 = *(uint *)((long)&(this->strings).fUnion + 4);
  }
  else {
    uVar5 = (int)sVar1 >> 5;
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar6 = (this->strings).fUnion.fFields.fArray;
  }
  else {
    pcVar6 = (char16_t *)((long)&(this->strings).fUnion + 2);
  }
  iVar2 = 0;
  do {
    lVar7 = (long)start;
    uVar4 = this->elements[lVar7].stringOffset + unitIndex + 1;
    cVar8 = L'\xffff';
    if (uVar4 < uVar5) {
      cVar8 = pcVar6[(int)uVar4];
    }
    do {
      lVar7 = lVar7 + 1;
      if (limit <= lVar7) {
        return iVar2 + 1;
      }
      uVar4 = this->elements[lVar7].stringOffset + unitIndex + 1;
      cVar3 = L'\xffff';
      if (uVar4 < uVar5) {
        cVar3 = pcVar6[(int)uVar4];
      }
      start = start + 1;
    } while (cVar8 == cVar3);
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

int32_t
UCharsTrieBuilder::countElementUnits(int32_t start, int32_t limit, int32_t unitIndex) const {
    int32_t length=0;  // Number of different units at unitIndex.
    int32_t i=start;
    do {
        UChar unit=elements[i++].charAt(unitIndex, strings);
        while(i<limit && unit==elements[i].charAt(unitIndex, strings)) {
            ++i;
        }
        ++length;
    } while(i<limit);
    return length;
}